

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhandler.cc
# Opt level: O1

int __thiscall
BdCallback::dhtValueCallback(BdCallback *this,bdNodeId *id,string *key,uint32_t status)

{
  BitDhtHandler *pBVar1;
  pointer pcVar2;
  int iVar3;
  long *local_48 [2];
  long local_38 [2];
  
  pBVar1 = this->mParent;
  pcVar2 = (key->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + key->_M_string_length);
  iVar3 = (*pBVar1->_vptr_BitDhtHandler[2])(pBVar1,id,local_48,(ulong)status);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return iVar3;
}

Assistant:

virtual int dhtValueCallback(const bdNodeId *id, std::string key, uint32_t status) {
        return mParent->ValueCallback(id, key, status);
    }